

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O1

void __thiscall
node::anon_unknown_2::ChainImpl::waitForNotificationsIfTipChanged(ChainImpl *this,uint256 *old_tip)

{
  uint256 *puVar1;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *puVar2;
  Chainstate *pCVar3;
  unique_ptr<ValidationSignals,_std::default_delete<ValidationSignals>_> *puVar4;
  long in_FS_OFFSET;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  unique_lock<std::recursive_mutex> local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  puVar1 = (uint256 *)
           std::
           __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                     (old_tip,old_tip + 1);
  if (puVar1 != old_tip + 1) {
    local_58._M_device = &cs_main.super_recursive_mutex;
    local_58._M_owns = false;
    std::unique_lock<std::recursive_mutex>::lock(&local_58);
    puVar2 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                       (&this->m_node->chainman,
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp"
                        ,0x35d,"chainman","m_node.chainman");
    pCVar3 = ChainstateManager::ActiveChainstate
                       ((puVar2->_M_t).
                        super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                        .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    puVar1 = (pCVar3->m_chain).vChain.
             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
             super__Vector_impl_data._M_finish[-1]->phashBlock;
    if (puVar1 == (uint256 *)0x0) {
      __assert_fail("phashBlock != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h"
                    ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
    }
    local_48 = *(undefined8 *)(puVar1->super_base_blob<256U>).m_data._M_elems;
    uStack_40 = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 8);
    local_38 = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x10);
    uStack_30 = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x18);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_58);
    auVar6[0] = -((old_tip->super_base_blob<256U>).m_data._M_elems[0x10] == (uchar)local_38);
    auVar6[1] = -((old_tip->super_base_blob<256U>).m_data._M_elems[0x11] == local_38._1_1_);
    auVar6[2] = -((old_tip->super_base_blob<256U>).m_data._M_elems[0x12] == local_38._2_1_);
    auVar6[3] = -((old_tip->super_base_blob<256U>).m_data._M_elems[0x13] == local_38._3_1_);
    auVar6[4] = -((old_tip->super_base_blob<256U>).m_data._M_elems[0x14] == local_38._4_1_);
    auVar6[5] = -((old_tip->super_base_blob<256U>).m_data._M_elems[0x15] == local_38._5_1_);
    auVar6[6] = -((old_tip->super_base_blob<256U>).m_data._M_elems[0x16] == local_38._6_1_);
    auVar6[7] = -((old_tip->super_base_blob<256U>).m_data._M_elems[0x17] == local_38._7_1_);
    auVar6[8] = -((old_tip->super_base_blob<256U>).m_data._M_elems[0x18] == (uchar)uStack_30);
    auVar6[9] = -((old_tip->super_base_blob<256U>).m_data._M_elems[0x19] == uStack_30._1_1_);
    auVar6[10] = -((old_tip->super_base_blob<256U>).m_data._M_elems[0x1a] == uStack_30._2_1_);
    auVar6[0xb] = -((old_tip->super_base_blob<256U>).m_data._M_elems[0x1b] == uStack_30._3_1_);
    auVar6[0xc] = -((old_tip->super_base_blob<256U>).m_data._M_elems[0x1c] == uStack_30._4_1_);
    auVar6[0xd] = -((old_tip->super_base_blob<256U>).m_data._M_elems[0x1d] == uStack_30._5_1_);
    auVar6[0xe] = -((old_tip->super_base_blob<256U>).m_data._M_elems[0x1e] == uStack_30._6_1_);
    auVar6[0xf] = -((old_tip->super_base_blob<256U>).m_data._M_elems[0x1f] == uStack_30._7_1_);
    auVar5[0] = -((old_tip->super_base_blob<256U>).m_data._M_elems[0] == (uchar)local_48);
    auVar5[1] = -((old_tip->super_base_blob<256U>).m_data._M_elems[1] == local_48._1_1_);
    auVar5[2] = -((old_tip->super_base_blob<256U>).m_data._M_elems[2] == local_48._2_1_);
    auVar5[3] = -((old_tip->super_base_blob<256U>).m_data._M_elems[3] == local_48._3_1_);
    auVar5[4] = -((old_tip->super_base_blob<256U>).m_data._M_elems[4] == local_48._4_1_);
    auVar5[5] = -((old_tip->super_base_blob<256U>).m_data._M_elems[5] == local_48._5_1_);
    auVar5[6] = -((old_tip->super_base_blob<256U>).m_data._M_elems[6] == local_48._6_1_);
    auVar5[7] = -((old_tip->super_base_blob<256U>).m_data._M_elems[7] == local_48._7_1_);
    auVar5[8] = -((old_tip->super_base_blob<256U>).m_data._M_elems[8] == (uchar)uStack_40);
    auVar5[9] = -((old_tip->super_base_blob<256U>).m_data._M_elems[9] == uStack_40._1_1_);
    auVar5[10] = -((old_tip->super_base_blob<256U>).m_data._M_elems[10] == uStack_40._2_1_);
    auVar5[0xb] = -((old_tip->super_base_blob<256U>).m_data._M_elems[0xb] == uStack_40._3_1_);
    auVar5[0xc] = -((old_tip->super_base_blob<256U>).m_data._M_elems[0xc] == uStack_40._4_1_);
    auVar5[0xd] = -((old_tip->super_base_blob<256U>).m_data._M_elems[0xd] == uStack_40._5_1_);
    auVar5[0xe] = -((old_tip->super_base_blob<256U>).m_data._M_elems[0xe] == uStack_40._6_1_);
    auVar5[0xf] = -((old_tip->super_base_blob<256U>).m_data._M_elems[0xf] == uStack_40._7_1_);
    auVar5 = auVar5 & auVar6;
    if ((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) | (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar5[0xf] >> 7) << 0xf) == 0xffff) goto LAB_009794af;
  }
  puVar4 = inline_assertion_check<true,std::unique_ptr<ValidationSignals,std::default_delete<ValidationSignals>>&>
                     (&this->m_node->validation_signals,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp"
                      ,0x35e,"validation_signals","m_node.validation_signals");
  ValidationSignals::SyncWithValidationInterfaceQueue
            ((puVar4->_M_t).
             super___uniq_ptr_impl<ValidationSignals,_std::default_delete<ValidationSignals>_>._M_t.
             super__Tuple_impl<0UL,_ValidationSignals_*,_std::default_delete<ValidationSignals>_>.
             super__Head_base<0UL,_ValidationSignals_*,_false>._M_head_impl);
LAB_009794af:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void waitForNotificationsIfTipChanged(const uint256& old_tip) override
    {
        if (!old_tip.IsNull() && old_tip == WITH_LOCK(::cs_main, return chainman().ActiveChain().Tip()->GetBlockHash())) return;
        validation_signals().SyncWithValidationInterfaceQueue();
    }